

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O0

bool callOnceGetSum(void)

{
  int iVar1;
  int iVar2;
  bool local_81;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  Test t;
  
  Test::Test((Test *)local_40);
  iVar1 = accessor::callFunction<accessor::FunctionWrapper<Test,int,int,int>,Test,int,int>
                    ((Test *)local_40,1,1);
  local_81 = false;
  if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"getSum",&local_71);
    iVar2 = Test::getMethodVisitedCounter((Test *)local_40,&local_70);
    local_81 = 0 < iVar2;
  }
  t.mVisitedMethods._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = local_81;
  if (iVar1 == 2) {
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  Test::~Test((Test *)local_40);
  return (bool)(t.mVisitedMethods._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1);
}

Assistant:

bool callOnceGetSum()
{
  Test t;

  return (::accessor::callFunction<TestGetSum>(t, 1, 1) == 2) &&
         (t.getMethodVisitedCounter("getSum") > 0);
}